

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Destroy<duckdb::ArgMinMaxState<duckdb::date_t,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  ArgMinMaxState<duckdb::date_t,_duckdb::string_t> *state;
  AggregateInputData *in_RDX;
  idx_t i;
  ArgMinMaxState<duckdb::date_t,_duckdb::string_t> **sdata;
  AggregateInputData *aggr_input_data_00;
  
  state = (ArgMinMaxState<duckdb::date_t,_duckdb::string_t> *)
          FlatVector::GetData<duckdb::ArgMinMaxState<duckdb::date_t,duckdb::string_t>*>
                    ((Vector *)0x88629d);
  for (aggr_input_data_00 = (AggregateInputData *)0x0; aggr_input_data_00 < in_RDX;
      aggr_input_data_00 = (AggregateInputData *)((long)&(aggr_input_data_00->bind_data).ptr + 1)) {
    ArgMinMaxBase<duckdb::LessThan,true>::
    Destroy<duckdb::ArgMinMaxState<duckdb::date_t,duckdb::string_t>>(state,aggr_input_data_00);
  }
  return;
}

Assistant:

static void Destroy(Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
		for (idx_t i = 0; i < count; i++) {
			OP::template Destroy<STATE_TYPE>(*sdata[i], aggr_input_data);
		}
	}